

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O1

void audit_regressor_feature(audit_regressor_data *dat,float param_2,uint64_t ft_idx)

{
  vw *pvVar1;
  ulong __val;
  bool bVar2;
  char cVar3;
  float *pfVar4;
  ostream *poVar5;
  long *plVar6;
  undefined8 *puVar7;
  weight *pwVar8;
  long *plVar9;
  ulong uVar10;
  char cVar11;
  pointer pbVar12;
  string temp;
  string ns_pre;
  string __str;
  ostringstream tempstream;
  long *local_248;
  ulong local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  ulong local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  char *local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  char local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pvVar1 = dat->all;
  if ((pvVar1->weights).sparse == true) {
    pfVar4 = sparse_parameters::operator[](&(pvVar1->weights).sparse_weights,ft_idx);
  }
  else {
    pfVar4 = (pvVar1->weights).dense_weights._begin +
             ((pvVar1->weights).dense_weights._weight_mask & ft_idx);
  }
  if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
    dat->values_audited = dat->values_audited + 1;
    local_1e8 = local_1d8;
    local_1e0 = 0;
    local_1d8[0] = 0;
    pbVar12 = (dat->ns_pre->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar12 !=
        (dat->ns_pre->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(pbVar12->_M_dataplus)._M_p);
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               (dat->ns_pre->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_248._0_1_ = (string)0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_248,1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_248 = (long *)CONCAT71(local_248._1_7_,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_248,1);
    if ((pvVar1->weights).sparse == true) {
      pfVar4 = sparse_parameters::operator[](&(pvVar1->weights).sparse_weights,ft_idx);
    }
    else {
      pfVar4 = (pvVar1->weights).dense_weights._begin +
               ((pvVar1->weights).dense_weights._weight_mask & ft_idx);
    }
    std::ostream::_M_insert<double>((double)*pfVar4);
    std::__cxx11::stringbuf::str();
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_1e8)
    ;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_218 = *plVar9;
      lStack_210 = plVar6[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar9;
      local_228 = (long *)*plVar6;
    }
    local_220 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_228,local_220,0,'\x01');
    local_248 = &local_238;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_238 = *plVar9;
      lStack_230 = plVar6[3];
    }
    else {
      local_238 = *plVar9;
      local_248 = (long *)*plVar6;
    }
    local_240 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_228 != &local_218) {
      operator_delete(local_228);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208);
    }
    if (1 < dat->total_class_cnt) {
      __val = dat->cur_class;
      cVar11 = '\x01';
      if (9 < __val) {
        uVar10 = __val;
        cVar3 = '\x04';
        do {
          cVar11 = cVar3;
          if (uVar10 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_001f4990;
          }
          if (uVar10 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_001f4990;
          }
          if (uVar10 < 10000) goto LAB_001f4990;
          bVar2 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar3 = cVar11 + '\x04';
        } while (bVar2);
        cVar11 = cVar11 + '\x01';
      }
LAB_001f4990:
      local_1c8 = local_1b8;
      std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_1c8,local_1c0,__val);
      plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_1c8,CONCAT44(uStack_1bc,local_1c0),0,'\x01');
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_1f8 = *plVar9;
        lStack_1f0 = plVar6[3];
        local_208 = &local_1f8;
      }
      else {
        local_1f8 = *plVar9;
        local_208 = (long *)*plVar6;
      }
      local_200 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_248);
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_218 = *plVar6;
        lStack_210 = puVar7[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *plVar6;
        local_228 = (long *)*puVar7;
      }
      local_220 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_248,(string *)&local_228);
      if (local_228 != &local_218) {
        operator_delete(local_228);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
    }
    io_buf::bin_write_fixed(dat->out_file,(char *)local_248,local_240 & 0xffffffff);
    if ((pvVar1->weights).sparse == true) {
      pwVar8 = sparse_parameters::operator[](&(pvVar1->weights).sparse_weights,ft_idx);
    }
    else {
      pwVar8 = (pvVar1->weights).dense_weights._begin +
               (ft_idx & (pvVar1->weights).dense_weights._weight_mask);
    }
    *pwVar8 = 0.0;
    if (local_248 != &local_238) {
      operator_delete(local_248);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
  }
  return;
}

Assistant:

inline void audit_regressor_feature(audit_regressor_data& dat, const float, const uint64_t ft_idx)
{
  parameters& weights = dat.all->weights;
  if (weights[ft_idx] != 0)
    ++dat.values_audited;
  else
    return;

  string ns_pre;
  for (vector<string>::const_iterator s = dat.ns_pre->begin(); s != dat.ns_pre->end(); ++s) ns_pre += *s;

  ostringstream tempstream;
  tempstream << ':' << ((ft_idx & weights.mask()) >> weights.stride_shift()) << ':' << weights[ft_idx];

  string temp = ns_pre + tempstream.str() + '\n';
  if (dat.total_class_cnt > 1)  // add class prefix for multiclass problems
    temp = to_string(dat.cur_class) + ':' + temp;

  dat.out_file->bin_write_fixed(temp.c_str(), (uint32_t)temp.size());

  weights[ft_idx] = 0.;  // mark value audited
}